

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUURI.cpp
# Opt level: O1

void __thiscall COLLADABU::URI::copyFrom(URI *this,URI *copyFrom)

{
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->mOriginalURIString);
  std::__cxx11::string::_M_assign((string *)&this->mScheme);
  std::__cxx11::string::_M_assign((string *)&this->mAuthority);
  std::__cxx11::string::_M_assign((string *)&this->mPath);
  std::__cxx11::string::_M_assign((string *)&this->mQuery);
  std::__cxx11::string::_M_assign((string *)&this->mFragment);
  this->mIsValid = copyFrom->mIsValid;
  return;
}

Assistant:

void URI::copyFrom(const URI& copyFrom)
	{
//		set(copyFrom.originalStr());
		mUriString = copyFrom.mUriString;
		mOriginalURIString = copyFrom.mOriginalURIString;
		mScheme = copyFrom.mScheme;
		mAuthority = copyFrom.mAuthority;
		mPath = copyFrom.mPath;
		mQuery = copyFrom.mQuery;
		mFragment = copyFrom.mFragment;
		mIsValid = copyFrom.mIsValid;
	}